

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnicodeSet::size(UnicodeSet *this)

{
  int32_t iVar1;
  UChar32 UVar2;
  UChar32 UVar3;
  int local_1c;
  int32_t i;
  int32_t count;
  int32_t n;
  UnicodeSet *this_local;
  
  i = 0;
  iVar1 = getRangeCount(this);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    UVar2 = getRangeEnd(this,local_1c);
    UVar3 = getRangeStart(this,local_1c);
    i = (UVar2 - UVar3) + 1 + i;
  }
  iVar1 = UVector::size(this->strings);
  return i + iVar1;
}

Assistant:

int32_t UnicodeSet::size(void) const {
    int32_t n = 0;
    int32_t count = getRangeCount();
    for (int32_t i = 0; i < count; ++i) {
        n += getRangeEnd(i) - getRangeStart(i) + 1;
    }
    return n + strings->size();
}